

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap_client.cpp
# Opt level: O0

void __thiscall zmq::zap_client_t::handle_zap_status_code(zap_client_t *this)

{
  char *pcVar1;
  endpoint_uri_pair_t *endpoint_uri_pair_;
  long *in_RDI;
  int status_code_numeric;
  int err_;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar2;
  
  uVar2 = 0;
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)(in_RDI + 5));
  endpoint_uri_pair_ = (endpoint_uri_pair_t *)(ulong)((int)*pcVar1 - 0x32);
  switch(endpoint_uri_pair_) {
  case (endpoint_uri_pair_t *)0x0:
    return;
  case (endpoint_uri_pair_t *)0x1:
    uVar2 = 300;
    break;
  case (endpoint_uri_pair_t *)0x2:
    uVar2 = 400;
    break;
  case (endpoint_uri_pair_t *)0x3:
    uVar2 = 500;
  }
  session_base_t::get_socket
            (*(session_base_t **)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x590));
  err_ = (int)((ulong)in_RDI >> 0x20);
  session_base_t::get_endpoint((session_base_t *)0x31fc96);
  socket_base_t::event_handshake_failed_auth
            ((socket_base_t *)CONCAT44(uVar2,in_stack_fffffffffffffff0),endpoint_uri_pair_,err_);
  return;
}

Assistant:

void zap_client_t::handle_zap_status_code ()
{
    //  we can assume here that status_code is a valid ZAP status code,
    //  i.e. 200, 300, 400 or 500
    int status_code_numeric = 0;
    switch (status_code[0]) {
        case '2':
            return;
        case '3':
            status_code_numeric = 300;
            break;
        case '4':
            status_code_numeric = 400;
            break;
        case '5':
            status_code_numeric = 500;
            break;
    }

    session->get_socket ()->event_handshake_failed_auth (
      session->get_endpoint (), status_code_numeric);
}